

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O3

ostream * psy::C::operator<<(ostream *os,TagDeclarationSymbol *tagTyDecl)

{
  TagDeclarationCategory TVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar3;
  char *pcVar4;
  
  if (tagTyDecl != (TagDeclarationSymbol *)0x0) {
    do {
      TVar1 = TagDeclarationSymbol::category(tagTyDecl);
      if (TVar1 != StructOrUnion) {
        if (TVar1 == Enum) {
          iVar2 = (*(tagTyDecl->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
                    _vptr_Symbol[0x1b])(tagTyDecl);
          poVar3 = operator<<(os,(EnumDeclarationSymbol *)CONCAT44(extraout_var_00,iVar2));
          return poVar3;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/TypeDeclaration_Tag.cpp"
                   ,0x65);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x85);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<empty message>",0xf);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        pcVar4 = "<invalid TagTypeDeclaration>";
        goto LAB_002d1bba;
      }
      iVar2 = (*(tagTyDecl->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
                _vptr_Symbol[0x1d])(tagTyDecl);
      tagTyDecl = (TagDeclarationSymbol *)CONCAT44(extraout_var,iVar2);
    } while (tagTyDecl != (TagDeclarationSymbol *)0x0);
  }
  pcVar4 = "<TagTypeDeclaration is null>";
LAB_002d1bba:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,0x1c);
  return os;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const TagDeclarationSymbol* tagTyDecl)
{
    if (!tagTyDecl)
        return os << "<TagTypeDeclaration is null>";
    switch (tagTyDecl->category()) {
        case TagDeclarationCategory::StructOrUnion:
            return os << tagTyDecl->asStructOrUnionDeclaration();
        case TagDeclarationCategory::Enum:
            return os << tagTyDecl->asEnumDeclaration();
    }
    PSY_ASSERT_1(false);
    return os << "<invalid TagTypeDeclaration>";
}